

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.h
# Opt level: O0

void Eigen::internal::ordering_helper_at_plus_a<Eigen::SparseMatrix<double,0,int>>
               (SparseMatrix<double,_0,_int> *A,SparseMatrix<double,_0,_int> *symmat)

{
  bool bVar1;
  SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
  *other;
  Index IVar2;
  non_const_type this;
  ConstTransposeReturnType CVar3;
  InnerIterator it;
  int i;
  SparseMatrix<double,_0,_int> C;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff20;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff30;
  SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *in_stack_ffffffffffffff40;
  SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *in_stack_ffffffffffffff48;
  InnerIterator local_a0;
  int local_78;
  SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> local_68;
  non_const_type local_60;
  SparseMatrix<double,_0,_int> local_58;
  
  SparseMatrix<double,_0,_int>::SparseMatrix(in_stack_ffffffffffffff30);
  CVar3 = SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::transpose
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)0x1e3aa1);
  this = CVar3.m_matrix;
  local_68.m_isRValue =
       (bool)CVar3.super_TransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Sparse>.
             super_SparseTransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_1024>.
             super_SparseCompressedBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>
             .super_SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>.
             m_isRValue;
  local_60 = this;
  SparseMatrix<double,0,int>::operator=
            (A,(SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *)
               symmat);
  local_78 = 0;
  while( true ) {
    other = (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
             *)(long)local_78;
    IVar2 = SparseMatrix<double,_0,_int>::rows(&local_58);
    if (IVar2 <= (long)other) break;
    SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
              ((InnerIterator *)this,
               (SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *)other,
               (Index)in_stack_ffffffffffffff20);
    while( true ) {
      bVar1 = SparseCompressedBase::InnerIterator::operator_cast_to_bool((InnerIterator *)&local_a0)
      ;
      if (!bVar1) break;
      in_stack_ffffffffffffff20 =
           (SparseMatrix<double,_0,_int> *)
           SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::valueRef
                     (&local_a0);
      *(Scalar *)in_stack_ffffffffffffff20 = 0.0;
      SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::operator++
                (&local_a0);
    }
    local_78 = local_78 + 1;
  }
  SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator+
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  SparseMatrix<double,0,int>::operator=(this,other);
  SparseMatrix<double,_0,_int>::~SparseMatrix(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void ordering_helper_at_plus_a(const MatrixType& A, MatrixType& symmat)
{
  MatrixType C;
  C = A.transpose(); // NOTE: Could be  costly
  for (int i = 0; i < C.rows(); i++) 
  {
      for (typename MatrixType::InnerIterator it(C, i); it; ++it)
        it.valueRef() = 0.0;
  }
  symmat = C + A;
}